

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

_Bool mi_option_is_enabled(mi_option_t option)

{
  long lVar1;
  
  lVar1 = mi_option_get(option);
  return lVar1 != 0;
}

Assistant:

mi_decl_nodiscard bool mi_option_is_enabled(mi_option_t option) {
  return (mi_option_get(option) != 0);
}